

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void putcontig8bitYCbCr12tile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  uint32_t local_68;
  uint32_t local_64;
  uint32_t b_2;
  uint32_t g_2;
  uint32_t r_2;
  uint32_t Cr_1;
  uint32_t Cb_1;
  uint32_t b_1;
  uint32_t g_1;
  uint32_t r_1;
  uint32_t b;
  uint32_t g;
  uint32_t r;
  uint32_t Cr;
  uint32_t Cb;
  int32_t incr;
  uint32_t *cp2;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  Cr = toskew * 2 + w;
  _Cb = cp + (ulong)w + (long)toskew;
  cp2._4_4_ = w;
  h_local = y;
  _y_local = cp;
  cp_local = (uint32_t *)img;
  for (cp2._0_4_ = h; 1 < (uint32_t)cp2; cp2._0_4_ = (uint32_t)cp2 - 2) {
    w_local = cp2._4_4_;
    do {
      r = (uint32_t)pp[2];
      g = (uint32_t)pp[3];
      TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)*pp,r,g,&b,&r_1,&g_1);
      *_y_local = b | r_1 << 8 | g_1 << 0x10 | 0xff000000;
      TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)pp[1],r,g,&b_1,&Cb_1,&Cr_1);
      *_Cb = b_1 | Cb_1 << 8 | Cr_1 << 0x10 | 0xff000000;
      _y_local = _y_local + 1;
      _Cb = _Cb + 1;
      pp = pp + 4;
      w_local = w_local - 1;
    } while (w_local != 0);
    _y_local = _y_local + (int)Cr;
    _Cb = _Cb + (int)Cr;
    pp = pp + (fromskew / 1 << 2);
  }
  if ((uint32_t)cp2 == 1) {
    w_local = cp2._4_4_;
    do {
      r_2 = (uint32_t)pp[2];
      g_2 = (uint32_t)pp[3];
      TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)*pp,r_2,g_2,&b_2,&local_64,
                     &local_68);
      *_y_local = b_2 | local_64 << 8 | local_68 << 0x10 | 0xff000000;
      _y_local = _y_local + 1;
      pp = pp + 4;
      w_local = w_local - 1;
    } while (w_local != 0);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putcontig8bitYCbCr12tile)
{
    uint32_t *cp2;
    int32_t incr = 2 * toskew + w;
    (void)y;
    fromskew = (fromskew / 1) * (1 * 2 + 2);
    cp2 = cp + w + toskew;
    while (h >= 2)
    {
        x = w;
        do
        {
            uint32_t Cb = pp[2];
            uint32_t Cr = pp[3];
            YCbCrtoRGB(cp[0], pp[0]);
            YCbCrtoRGB(cp2[0], pp[1]);
            cp++;
            cp2++;
            pp += 4;
        } while (--x);
        cp += incr;
        cp2 += incr;
        pp += fromskew;
        h -= 2;
    }
    if (h == 1)
    {
        x = w;
        do
        {
            uint32_t Cb = pp[2];
            uint32_t Cr = pp[3];
            YCbCrtoRGB(cp[0], pp[0]);
            cp++;
            pp += 4;
        } while (--x);
    }
}